

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp128.hpp
# Opt level: O3

unsigned_long
duckdb::Chimp128Decompression<unsigned_long>::DecompressValue
          (Flags flag,uint8_t *leading_zeros,uint32_t *leading_zero_index,
          UnpackedData *unpacked_data,uint32_t *unpacked_index,DecompressState *state)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  unsigned_long uVar8;
  InternalException *this;
  sbyte sVar9;
  uint64_t uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t uVar14;
  byte bVar15;
  undefined7 in_register_00000039;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint8_t *puVar19;
  string local_50;
  
  uVar12 = CONCAT71(in_register_00000039,flag) & 0xffffffff;
  switch(uVar12) {
  case 0:
    uVar16 = (state->input).index;
    uVar11 = uVar16 & 7;
    puVar19 = (state->input).input;
    bVar5 = puVar19[uVar16 >> 3];
    bVar15 = BitReader::REMAINDER_MASKS[(ulong)uVar11 + 7];
    bVar1 = puVar19[((ulong)(uVar16 >> 3) + 1) - (ulong)((ulong)uVar11 == 0)];
    (state->input).index = uVar16 + 7;
    uVar8 = (state->ring_buffer).buffer
            [(uint)(byte)((bVar15 & bVar1) >> (1U - (char)uVar16 & 7)) |
             ((uint)bVar5 << (sbyte)uVar11) >> 1 & 0x7f];
    goto LAB_016e8bf5;
  case 1:
    uVar16 = *unpacked_index;
    *unpacked_index = uVar16 + 1;
    uVar14 = unpacked_data[uVar16].leading_zero;
    state->leading_zeros = uVar14;
    bVar15 = 0x40 - (uVar14 + unpacked_data[uVar16].significant_bits);
    state->trailing_zeros = bVar15;
    bVar5 = unpacked_data[uVar16].significant_bits;
    if (bVar5 < 8) {
      uVar11 = (state->input).index;
      puVar19 = (state->input).input;
      uVar6 = uVar11 & 7;
      uVar17 = (ulong)(uVar11 >> 3);
      uVar12 = 0;
      uVar13 = 0;
    }
    else {
      uVar12 = (ulong)(bVar5 >> 3);
      puVar19 = (state->input).input;
      uVar11 = (state->input).index;
      uVar17 = (ulong)(uVar11 >> 3);
      uVar6 = uVar11 & 7;
      uVar18 = 0;
      uVar13 = 0;
      do {
        uVar13 = (ulong)(((uint)CONCAT11(puVar19[uVar18 + uVar17],
                                         puVar19[uVar18 + uVar17 + 1] &
                                         BitReader::REMAINDER_MASKS[(ulong)uVar6 + 8]) <<
                         ((byte)uVar11 & 7)) >> 8 & 0xff) | uVar13 << 8;
        uVar18 = uVar18 + 1;
      } while (uVar12 != uVar18);
    }
    uVar7 = bVar5 & 7;
    sVar9 = (sbyte)uVar7;
    bVar1 = puVar19[uVar12 + uVar17];
    bVar2 = BitReader::MASKS[uVar7];
    bVar3 = BitReader::REMAINDER_MASKS[(byte)(((byte)uVar11 & 7) + sVar9)];
    bVar4 = puVar19[(uVar12 + uVar17 + 1) - (ulong)(uVar6 + uVar7 < 8)];
    (state->input).index = bVar5 + uVar11;
    uVar8 = ((ulong)((uint)(byte)((bVar3 & bVar4) >> (-(bVar5 + (byte)uVar11) & 7)) |
                    ((uint)bVar2 & (uint)bVar1 << (sbyte)uVar6) >> (8U - sVar9 & 0x1f)) |
            uVar13 << sVar9) << (bVar15 & 0x3f) ^
            (state->ring_buffer).buffer[unpacked_data[uVar16].index];
    goto LAB_016e8bf5;
  case 2:
    uVar14 = state->leading_zeros;
    bVar5 = 0x40 - uVar14;
    if (bVar5 < 8) {
LAB_016e898a:
      uVar16 = (state->input).index;
      puVar19 = (state->input).input;
      uVar11 = uVar16 & 7;
      uVar13 = (ulong)(uVar16 >> 3);
      uVar17 = 0;
      uVar12 = 0;
    }
    else {
      puVar19 = (state->input).input;
      uVar16 = (state->input).index;
      uVar13 = (ulong)(uVar16 >> 3);
      uVar11 = uVar16 & 7;
      uVar17 = (ulong)(bVar5 >> 3);
      uVar18 = 0;
      uVar12 = 0;
      do {
        uVar12 = (ulong)(((uint)CONCAT11(puVar19[uVar18 + uVar13],
                                         puVar19[uVar18 + uVar13 + 1] &
                                         BitReader::REMAINDER_MASKS[(ulong)uVar11 + 8]) <<
                         ((byte)uVar16 & 7)) >> 8 & 0xff) | uVar12 << 8;
        uVar18 = uVar18 + 1;
      } while (uVar17 != uVar18);
    }
    break;
  case 3:
    uVar16 = *leading_zero_index;
    *leading_zero_index = uVar16 + 1;
    uVar14 = leading_zeros[uVar16];
    state->leading_zeros = uVar14;
    bVar5 = 0x40 - uVar14;
    if (bVar5 < 8) goto LAB_016e898a;
    puVar19 = (state->input).input;
    uVar16 = (state->input).index;
    uVar13 = (ulong)(uVar16 >> 3);
    uVar11 = uVar16 & 7;
    uVar17 = (ulong)(bVar5 >> 3);
    uVar18 = 0;
    uVar12 = 0;
    do {
      uVar12 = (ulong)(((uint)CONCAT11(puVar19[uVar18 + uVar13],
                                       puVar19[uVar18 + uVar13 + 1] &
                                       BitReader::REMAINDER_MASKS[(ulong)uVar11 + 8]) <<
                       ((byte)uVar16 & 7)) >> 8 & 0xff) | uVar12 << 8;
      uVar18 = uVar18 + 1;
    } while (uVar17 != uVar18);
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Chimp compression flag with value %d not recognized","");
    InternalException::InternalException<duckdb::ChimpConstants::Flags>
              (this,&local_50,(Flags)uVar12);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar6 = bVar5 & 7;
  sVar9 = (sbyte)uVar6;
  bVar15 = puVar19[uVar17 + uVar13];
  bVar1 = BitReader::MASKS[uVar6];
  bVar2 = BitReader::REMAINDER_MASKS[(byte)(((byte)uVar16 & 7) + sVar9)];
  bVar3 = puVar19[(uVar17 + uVar13 + 1) - (ulong)(uVar11 + uVar6 < 8)];
  (state->input).index = uVar16 + bVar5;
  uVar8 = ((ulong)((uint)(byte)((bVar2 & bVar3) >> (uVar14 - (byte)uVar16 & 7)) |
                  ((uint)bVar1 & (uint)bVar15 << (sbyte)uVar11) >> (8U - sVar9 & 0x1f)) |
          uVar12 << sVar9) ^ state->reference_value;
LAB_016e8bf5:
  state->reference_value = uVar8;
  uVar10 = (state->ring_buffer).index + 1;
  (state->ring_buffer).index = uVar10;
  (state->ring_buffer).buffer[(uint)uVar10 & 0x7f] = uVar8;
  return uVar8;
}

Assistant:

static inline CHIMP_TYPE DecompressValue(ChimpConstants::Flags flag, uint8_t leading_zeros[],
	                                         uint32_t &leading_zero_index, UnpackedData unpacked_data[],
	                                         uint32_t &unpacked_index, DecompressState &state) {
		CHIMP_TYPE result;
		switch (flag) {
		case ChimpConstants::Flags::VALUE_IDENTICAL: {
			//! Value is identical to previous value
			auto index = state.input.template ReadValue<uint8_t, 7>();
			result = UnsafeNumericCast<CHIMP_TYPE>(state.ring_buffer.Value(index));
			break;
		}
		case ChimpConstants::Flags::TRAILING_EXCEEDS_THRESHOLD: {
			const UnpackedData &unpacked = unpacked_data[unpacked_index++];
			state.leading_zeros = unpacked.leading_zero;
			state.trailing_zeros = BIT_SIZE - unpacked.significant_bits - state.leading_zeros;
			result = state.input.template ReadValue<CHIMP_TYPE>(unpacked.significant_bits);
			result <<= state.trailing_zeros;
			result ^= state.ring_buffer.Value(unpacked.index);
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_EQUALITY: {
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		case ChimpConstants::Flags::LEADING_ZERO_LOAD: {
			state.leading_zeros = leading_zeros[leading_zero_index++];
			D_ASSERT(state.leading_zeros <= BIT_SIZE);
			result = state.input.template ReadValue<CHIMP_TYPE>(BIT_SIZE - state.leading_zeros);
			result ^= state.reference_value;
			break;
		}
		default:
			throw InternalException("Chimp compression flag with value %d not recognized", flag);
		}
		state.reference_value = result;
		state.ring_buffer.InsertScan(result);
		return result;
	}